

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O3

int doredraw(void)

{
  boolean bVar1;
  int x;
  int y;
  
  if (u.ux != '\0') {
    if ((u._1052_1_ & 1) == 0) {
      if (((u._1052_1_ & 2) == 0) ||
         (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 != '\0')) {
        if ((u._1052_1_ & 0x20) == 0) {
          vision_recalc(2);
          x = 1;
          do {
            y = 0;
            do {
              dbuf_set(level,x,y,(rm *)0x0,-1,-1,-1,-1,-1,-1,-1,0,0,0);
              y = y + 1;
            } while (y != 0x15);
            x = x + 1;
          } while (x != 0x50);
          vision_recalc(0);
          see_monsters();
          iflags.botl = '\x01';
        }
        else if ((u._1052_1_ & 1) == 0) {
          memset(dbuf,0,0x9d80);
          under_ground_dela = 0;
        }
      }
      else {
        under_water(1);
      }
    }
    else {
      swallowed(1);
    }
  }
  return 0;
}

Assistant:

int doredraw(void)
{
    int x,y;

    if (!u.ux)
	return 0; /* display isn't ready yet */

    if (u.uswallow) {
	swallowed(1);
	return 0;
    }
    if (Underwater && !Is_waterlevel(&u.uz)) {
	under_water(1);
	return 0;
    }
    if (u.uburied) {
	under_ground(1);
	return 0;
    }

    /* shut down vision */
    vision_recalc(2);

    /* display memory */
    for (x = 1; x < COLNO; x++) {
	for (y = 0; y < ROWNO; y++)
	    dbuf_set_loc(x, y);
    }

    /* see what is to be seen */
    vision_recalc(0);

    /* overlay with monsters */
    see_monsters();

    iflags.botl = 1;	/* force a redraw of the bottom line */
    return 0;
}